

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

Generator<std::tuple<int>_> cppqc::tupleOf<int>(Generator<int> *g)

{
  __uniq_ptr_impl<cppqc::detail::GenConcept<std::tuple<int>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
  in_RDI;
  Generator<int> *in_stack_ffffffffffffffb8;
  TupleGenerator<int> *in_stack_ffffffffffffffd8;
  Generator<std::tuple<int>_> *in_stack_ffffffffffffffe0;
  
  detail::TupleGenerator<int>::TupleGenerator
            ((TupleGenerator<int> *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
             .super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_false>.
             _M_head_impl,in_stack_ffffffffffffffb8);
  Generator<std::tuple<int>>::Generator<cppqc::detail::TupleGenerator<int>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  detail::TupleGenerator<int>::~TupleGenerator((TupleGenerator<int> *)0x43018a);
  return (unique_ptr<cppqc::detail::GenConcept<std::tuple<int>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
          )(unique_ptr<cppqc::detail::GenConcept<std::tuple<int>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
            )in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
             .super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_false>.
             _M_head_impl;
}

Assistant:

Generator<std::tuple<T...>> tupleOf(const Generator<T>&... g) {
  return detail::TupleGenerator<T...>(g...);
}